

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesEncoder::TransformAttributesToPortableFormat(KdTreeAttributesEncoder *this)

{
  byte bVar1;
  PointCloudEncoder *pPVar2;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> attribute;
  EncoderOptions *pEVar3;
  bool bVar4;
  pointer piVar5;
  uint uVar6;
  uint32_t i;
  int iVar7;
  ulong uVar8;
  int iVar9;
  AttributeValueIndex avi;
  uint uVar10;
  AttributeValueIndex att_index;
  pointer piVar11;
  long lVar12;
  float range;
  allocator<char> local_dd;
  int att_id;
  KdTreeAttributesEncoder *local_d8;
  allocator<char> local_c9;
  vector<int,_std::allocator<int>_> act_value;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> portable_att;
  vector<int,_std::allocator<int>_> min_value;
  
  piVar5 = (this->super_AttributesEncoder).point_attribute_ids_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar11 = (this->super_AttributesEncoder).point_attribute_ids_.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  iVar9 = 0;
  for (iVar7 = 0; (int)((ulong)((long)piVar11 - (long)piVar5) >> 2) != iVar7; iVar7 = iVar7 + 1) {
    iVar9 = iVar9 + (uint)*(byte *)((long)(((this->super_AttributesEncoder).point_cloud_encoder_)->
                                           point_cloud_->attributes_).
                                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[piVar5[iVar7]].
                                          _M_t.
                                          super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                          ._M_t + 0x18);
  }
  this->num_components_ = iVar9;
  uVar6 = 0;
  local_d8 = this;
  do {
    uVar10 = (uint)((ulong)((long)piVar11 - (long)piVar5) >> 2);
    if (uVar10 <= uVar6) {
LAB_00159cf0:
      return uVar10 <= uVar6;
    }
    att_id = piVar5[(int)uVar6];
    pPVar2 = (local_d8->super_AttributesEncoder).point_cloud_encoder_;
    attribute._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
         (pPVar2->point_cloud_->attributes_).
         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_id]._M_t.
         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
         _M_t;
    switch(*(DataType *)
            ((long)attribute._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x1c)) {
    case DT_INT8:
    case DT_INT16:
    case DT_INT32:
      act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,0x7fffffff);
      std::vector<int,_std::allocator<int>_>::vector
                (&min_value,
                 (ulong)*(uint8_t *)
                         ((long)attribute._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                         + 0x18),(value_type_conflict1 *)&act_value,(allocator_type *)&portable_att)
      ;
      std::vector<int,_std::allocator<int>_>::vector
                (&act_value,
                 (ulong)*(uint8_t *)
                         ((long)attribute._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                         + 0x18),(allocator_type *)&portable_att);
      for (att_index.value_ = 0;
          att_index.value_ <
          *(ValueType *)
           ((long)attribute._M_t.
                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x60);
          att_index.value_ = att_index.value_ + 1) {
        GeometryAttribute::ConvertValue<int>
                  ((GeometryAttribute *)
                   attribute._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,att_index,
                   act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        bVar1 = *(uint8_t *)
                 ((long)attribute._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x18);
        for (uVar8 = 0; bVar1 != uVar8; uVar8 = uVar8 + 1) {
          if (act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] <
              min_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8]) {
            min_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar8] =
                 act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
          }
        }
      }
      lVar12 = 0;
      for (uVar8 = 0;
          uVar8 < *(uint8_t *)
                   ((long)attribute._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x18
                   ); uVar8 = uVar8 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->min_signed_values_,
                   (value_type_conflict1 *)
                   ((long)min_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar12));
        lVar12 = lVar12 + 4;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&act_value.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&min_value.super__Vector_base<int,_std::allocator<int>_>);
      break;
    case DT_FLOAT32:
      min_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__AttributeQuantizationTransform_001d3aa0;
      min_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0xffffffff;
      min_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pEVar3 = pPVar2->options_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&act_value,"quantization_bits",(allocator<char> *)&portable_att);
      iVar7 = DracoOptions<int>::GetAttributeInt
                        (&pEVar3->super_DracoOptions<int>,&att_id,(string *)&act_value,-1);
      std::__cxx11::string::~string((string *)&act_value);
      if (iVar7 < 1) {
LAB_00159ce1:
        AttributeQuantizationTransform::~AttributeQuantizationTransform
                  ((AttributeQuantizationTransform *)&min_value);
        goto LAB_00159cf0;
      }
      pEVar3 = ((local_d8->super_AttributesEncoder).point_cloud_encoder_)->options_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&act_value,"quantization_origin",&local_dd);
      bVar4 = DracoOptions<int>::IsAttributeOptionSet
                        (&pEVar3->super_DracoOptions<int>,&att_id,(string *)&act_value);
      if (bVar4) {
        pEVar3 = ((local_d8->super_AttributesEncoder).point_cloud_encoder_)->options_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&portable_att,"quantization_range",&local_c9);
        bVar4 = DracoOptions<int>::IsAttributeOptionSet
                          (&pEVar3->super_DracoOptions<int>,&att_id,(string *)&portable_att);
        std::__cxx11::string::~string((string *)&portable_att);
        std::__cxx11::string::~string((string *)&act_value);
        if (!bVar4) goto LAB_00159c35;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&portable_att,
                   (ulong)*(uint8_t *)
                           ((long)attribute._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl + 0x18),(allocator_type *)&act_value);
        pEVar3 = ((local_d8->super_AttributesEncoder).point_cloud_encoder_)->options_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&act_value,"quantization_origin",&local_dd);
        DracoOptions<int>::GetAttributeVector<float>
                  (&pEVar3->super_DracoOptions<int>,&att_id,(string *)&act_value,
                   (uint)*(uint8_t *)
                          ((long)attribute._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                          + 0x18),
                   (float *)portable_att._M_t.
                            super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
        std::__cxx11::string::~string((string *)&act_value);
        pEVar3 = ((local_d8->super_AttributesEncoder).point_cloud_encoder_)->options_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&act_value,"quantization_range",&local_dd);
        range = DracoOptions<int>::GetAttributeFloat
                          (&pEVar3->super_DracoOptions<int>,&att_id,(string *)&act_value,1.0);
        std::__cxx11::string::~string((string *)&act_value);
        AttributeQuantizationTransform::SetParameters
                  ((AttributeQuantizationTransform *)&min_value,iVar7,
                   (float *)portable_att._M_t.
                            super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                   (uint)*(uint8_t *)
                          ((long)attribute._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                          + 0x18),range);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&portable_att);
      }
      else {
        std::__cxx11::string::~string((string *)&act_value);
LAB_00159c35:
        bVar4 = AttributeQuantizationTransform::ComputeParameters
                          ((AttributeQuantizationTransform *)&min_value,
                           (PointAttribute *)
                           attribute._M_t.
                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,iVar7
                          );
        if (!bVar4) goto LAB_00159ce1;
      }
      std::
      vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
      ::push_back(&this->attribute_quantization_transforms_,(value_type *)&min_value);
      AttributeTransform::InitTransformedAttribute
                ((AttributeTransform *)&portable_att,(PointAttribute *)&min_value,
                 (int)attribute._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
      act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      act_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      AttributeQuantizationTransform::TransformAttribute
                ((AttributeQuantizationTransform *)&min_value,
                 (PointAttribute *)
                 attribute._M_t.
                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                 (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *)&act_value,
                 (PointAttribute *)
                 portable_att._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
      std::
      _Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      ::~_Vector_base((_Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                       *)&act_value);
      std::
      vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
      ::
      emplace_back<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>
                ((vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
                  *)&this->quantized_portable_attributes_,&portable_att);
      std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
      ~unique_ptr(&portable_att);
      AttributeQuantizationTransform::~AttributeQuantizationTransform
                ((AttributeQuantizationTransform *)&min_value);
    }
    uVar6 = uVar6 + 1;
    piVar5 = (local_d8->super_AttributesEncoder).point_attribute_ids_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar11 = (local_d8->super_AttributesEncoder).point_attribute_ids_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  } while( true );
}

Assistant:

bool KdTreeAttributesEncoder::EncodeDataNeededByPortableTransforms(
    EncoderBuffer *out_buffer) {
  // Store quantization settings for all attributes that need it.
  for (int i = 0; i < attribute_quantization_transforms_.size(); ++i) {
    attribute_quantization_transforms_[i].EncodeParameters(out_buffer);
  }

  // Encode data needed for transforming signed integers to unsigned ones.
  for (int i = 0; i < min_signed_values_.size(); ++i) {
    EncodeVarint<int32_t>(min_signed_values_[i], out_buffer);
  }
  return true;
}